

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_get_tile(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                         opj_event_mgr_t *p_manager,OPJ_UINT32 tile_index)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  opj_image_comp_t *poVar4;
  OPJ_BOOL OVar5;
  opj_image_comp_t *poVar6;
  opj_image_t *poVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  char *fmt;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  
  if (p_image == (opj_image_t *)0x0) {
    fmt = "We need an image previously created.\n";
  }
  else {
    uVar1 = p_image->numcomps;
    poVar7 = p_j2k->m_private_image;
    if (poVar7->numcomps <= uVar1) {
      uVar2 = (p_j2k->m_cp).tw;
      uVar15 = (p_j2k->m_cp).th * uVar2;
      if (uVar15 <= tile_index) {
        opj_event_msg(p_manager,1,"Tile index provided by the user is incorrect %d (max = %d) \n",
                      tile_index,(ulong)(uVar15 - 1));
        return 0;
      }
      uVar9 = (p_j2k->m_cp).tdx * (tile_index % uVar2) + (p_j2k->m_cp).tx0;
      p_image->x0 = uVar9;
      uVar15 = poVar7->x0;
      if (uVar9 <= uVar15) {
        uVar9 = uVar15;
      }
      p_image->x0 = uVar9;
      uVar10 = (tile_index % uVar2 + 1) * (p_j2k->m_cp).tdx + (p_j2k->m_cp).tx0;
      p_image->x1 = uVar10;
      uVar15 = p_j2k->m_private_image->x1;
      if (uVar15 <= uVar10) {
        uVar10 = uVar15;
      }
      p_image->x1 = uVar10;
      uVar12 = (p_j2k->m_cp).tdy * (tile_index / uVar2) + (p_j2k->m_cp).ty0;
      p_image->y0 = uVar12;
      uVar15 = p_j2k->m_private_image->y0;
      if (uVar12 <= uVar15) {
        uVar12 = uVar15;
      }
      p_image->y0 = uVar12;
      uVar15 = (tile_index / uVar2 + 1) * (p_j2k->m_cp).tdy + (p_j2k->m_cp).ty0;
      p_image->y1 = uVar15;
      uVar2 = p_j2k->m_private_image->y1;
      if (uVar2 <= uVar15) {
        uVar15 = uVar2;
      }
      p_image->y1 = uVar15;
      uVar2 = p_j2k->m_private_image->numcomps;
      uVar19 = (ulong)uVar2;
      if (uVar19 != 0) {
        poVar6 = p_image->comps;
        poVar4 = p_j2k->m_private_image->comps;
        lVar20 = 0;
        do {
          uVar3 = *(undefined4 *)((long)&poVar4->factor + lVar20);
          *(undefined4 *)((long)&poVar6->factor + lVar20) = uVar3;
          lVar16 = (long)*(int *)((long)&poVar6->dx + lVar20);
          if (lVar16 == 0) {
LAB_0011adb9:
            __assert_fail("b",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                          ,0xa2,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
          }
          iVar13 = (int)(((int)uVar9 + lVar16 + -1) / lVar16);
          *(int *)((long)&poVar6->x0 + lVar20) = iVar13;
          lVar18 = (long)*(int *)((long)&poVar6->dy + lVar20);
          if (lVar18 == 0) goto LAB_0011adb9;
          iVar14 = (int)(((int)uVar12 + lVar18 + -1) / lVar18);
          *(int *)((long)&poVar6->y0 + lVar20) = iVar14;
          bVar8 = (byte)uVar3;
          lVar17 = -1L << (bVar8 & 0x3f);
          *(int *)((long)&poVar6->w + lVar20) =
               (int)(lVar17 - iVar13 >> (bVar8 & 0x3f)) -
               (int)(lVar17 - (int)((lVar16 + (long)(int)uVar10 + -1) / lVar16) >> (bVar8 & 0x3f));
          *(int *)((long)&poVar6->h + lVar20) =
               (int)(lVar17 - iVar14 >> (bVar8 & 0x3f)) -
               (int)(lVar17 - (int)((lVar18 + (int)uVar15 + -1) / lVar18) >> (bVar8 & 0x3f));
          lVar20 = lVar20 + 0x40;
        } while (uVar19 << 6 != lVar20);
      }
      if (uVar2 < uVar1) {
        poVar6 = p_image->comps;
        uVar11 = uVar19 << 6 | 0x30;
        do {
          opj_image_data_free(*(void **)((long)&poVar6->dx + uVar11));
          poVar6 = p_image->comps;
          *(undefined8 *)((long)&poVar6->dx + uVar11) = 0;
          uVar19 = uVar19 + 1;
          uVar11 = uVar11 + 0x40;
        } while (uVar19 < p_image->numcomps);
        p_image->numcomps = p_j2k->m_private_image->numcomps;
      }
      if (p_j2k->m_output_image != (opj_image_t *)0x0) {
        opj_image_destroy(p_j2k->m_output_image);
      }
      poVar7 = opj_image_create0();
      p_j2k->m_output_image = poVar7;
      if (poVar7 == (opj_image_t *)0x0) {
        return 0;
      }
      opj_copy_image_header(p_image,poVar7);
      (p_j2k->m_specific_param).m_decoder.m_tile_ind_to_dec = tile_index;
      if (p_manager == (opj_event_mgr_t *)0x0) {
        __assert_fail("p_manager != 00",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                      ,0x2e8d,"OPJ_BOOL opj_j2k_setup_decoding_tile(opj_j2k_t *, opj_event_mgr_t *)"
                     );
      }
      OVar5 = opj_procedure_list_add_procedure
                        (p_j2k->m_procedure_list,opj_j2k_decode_one_tile,p_manager);
      if (OVar5 == 0) {
        return 0;
      }
      OVar5 = opj_j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
      if (OVar5 == 0) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = (opj_image_t *)0x0;
        return 0;
      }
      OVar5 = opj_j2k_move_data_from_codec_to_output_image(p_j2k,p_image);
      return OVar5;
    }
    fmt = "Image has less components than codestream.\n";
  }
  opj_event_msg(p_manager,1,fmt);
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_get_tile(opj_j2k_t *p_j2k,
                          opj_stream_private_t *p_stream,
                          opj_image_t* p_image,
                          opj_event_mgr_t * p_manager,
                          OPJ_UINT32 tile_index)
{
    OPJ_UINT32 compno;
    OPJ_UINT32 l_tile_x, l_tile_y;
    opj_image_comp_t* l_img_comp;

    if (!p_image) {
        opj_event_msg(p_manager, EVT_ERROR, "We need an image previously created.\n");
        return OPJ_FALSE;
    }

    if (p_image->numcomps < p_j2k->m_private_image->numcomps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Image has less components than codestream.\n");
        return OPJ_FALSE;
    }

    if (/*(tile_index < 0) &&*/ (tile_index >= p_j2k->m_cp.tw * p_j2k->m_cp.th)) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Tile index provided by the user is incorrect %d (max = %d) \n", tile_index,
                      (p_j2k->m_cp.tw * p_j2k->m_cp.th) - 1);
        return OPJ_FALSE;
    }

    /* Compute the dimension of the desired tile*/
    l_tile_x = tile_index % p_j2k->m_cp.tw;
    l_tile_y = tile_index / p_j2k->m_cp.tw;

    p_image->x0 = l_tile_x * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
    if (p_image->x0 < p_j2k->m_private_image->x0) {
        p_image->x0 = p_j2k->m_private_image->x0;
    }
    p_image->x1 = (l_tile_x + 1) * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
    if (p_image->x1 > p_j2k->m_private_image->x1) {
        p_image->x1 = p_j2k->m_private_image->x1;
    }

    p_image->y0 = l_tile_y * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
    if (p_image->y0 < p_j2k->m_private_image->y0) {
        p_image->y0 = p_j2k->m_private_image->y0;
    }
    p_image->y1 = (l_tile_y + 1) * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
    if (p_image->y1 > p_j2k->m_private_image->y1) {
        p_image->y1 = p_j2k->m_private_image->y1;
    }

    l_img_comp = p_image->comps;
    for (compno = 0; compno < p_j2k->m_private_image->numcomps; ++compno) {
        OPJ_INT32 l_comp_x1, l_comp_y1;

        l_img_comp->factor = p_j2k->m_private_image->comps[compno].factor;

        l_img_comp->x0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->x0,
                         (OPJ_INT32)l_img_comp->dx);
        l_img_comp->y0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->y0,
                         (OPJ_INT32)l_img_comp->dy);
        l_comp_x1 = opj_int_ceildiv((OPJ_INT32)p_image->x1, (OPJ_INT32)l_img_comp->dx);
        l_comp_y1 = opj_int_ceildiv((OPJ_INT32)p_image->y1, (OPJ_INT32)l_img_comp->dy);

        l_img_comp->w = (OPJ_UINT32)(opj_int_ceildivpow2(l_comp_x1,
                                     (OPJ_INT32)l_img_comp->factor) - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->x0,
                                             (OPJ_INT32)l_img_comp->factor));
        l_img_comp->h = (OPJ_UINT32)(opj_int_ceildivpow2(l_comp_y1,
                                     (OPJ_INT32)l_img_comp->factor) - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->y0,
                                             (OPJ_INT32)l_img_comp->factor));

        l_img_comp++;
    }

    if (p_image->numcomps > p_j2k->m_private_image->numcomps) {
        /* Can happen when calling repeatdly opj_get_decoded_tile() on an
         * image with a color palette, where color palette expansion is done
         * later in jp2.c */
        for (compno = p_j2k->m_private_image->numcomps; compno < p_image->numcomps;
                ++compno) {
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = NULL;
        }
        p_image->numcomps = p_j2k->m_private_image->numcomps;
    }

    /* Destroy the previous output image*/
    if (p_j2k->m_output_image) {
        opj_image_destroy(p_j2k->m_output_image);
    }

    /* Create the output image from the information previously computed*/
    p_j2k->m_output_image = opj_image_create0();
    if (!(p_j2k->m_output_image)) {
        return OPJ_FALSE;
    }
    opj_copy_image_header(p_image, p_j2k->m_output_image);

    p_j2k->m_specific_param.m_decoder.m_tile_ind_to_dec = (OPJ_INT32)tile_index;

    /* customization of the decoding */
    if (!opj_j2k_setup_decoding_tile(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    /* Decode the codestream */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_procedure_list, p_stream, p_manager)) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;
        return OPJ_FALSE;
    }

    /* Move data and copy one information from codec to output image*/
    return opj_j2k_move_data_from_codec_to_output_image(p_j2k, p_image);
}